

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

bool nivalis::anon_unknown_10::parse_polyline_expr
               (string *expr_str,Function *func,Environment *env,int x_var,int y_var,int t_var,
               string *parse_err)

{
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *this;
  byte bVar1;
  pointer pEVar2;
  uint32_t addr;
  uint32_t addr_00;
  bool bVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  pointer __pos;
  long lVar8;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tmp_err;
  Expr e1;
  string s;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  vector<nivalis::Expr,_std::allocator<nivalis::Expr>_> *local_90;
  Environment *local_88;
  Function *local_80;
  Expr local_78;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  string local_50;
  
  local_88 = env;
  local_80 = func;
  local_5c = y_var;
  local_58 = t_var;
  local_54 = x_var;
  if (expr_str->_M_string_length == 0) {
    bVar6 = false;
  }
  else {
    uVar4 = func->type & 0xfffffff8;
    local_90 = &func->exprs;
    lVar8 = 0;
    uVar7 = 0;
    bVar3 = false;
    bVar6 = false;
    do {
      bVar1 = (expr_str->_M_dataplus)._M_p[uVar7];
      iVar5 = isspace((int)(char)bVar1);
      if (iVar5 == 0) {
        if (bVar1 < 0x5d) {
          if (bVar1 != 0x28) {
            if (bVar1 == 0x29) goto LAB_001298cc;
            if (bVar1 != 0x5b) goto LAB_001298cf;
          }
LAB_001298c7:
          lVar8 = lVar8 + 1;
        }
        else if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
LAB_001298cc:
          lVar8 = lVar8 + -1;
        }
        else if (bVar1 == 0x7b) goto LAB_001298c7;
LAB_001298cf:
        if (bVar1 == 0x2c) {
          if (lVar8 == 1) {
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            local_b0._M_string_length = 0;
            local_b0.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::substr((ulong)&local_50,(ulong)expr_str);
            parse(&local_78,&local_50,local_88,true,true,0,&local_b0);
            util::rtrim(&local_b0);
            if ((uVar4 == 0x80) && (local_b0._M_string_length != 0)) {
              parse((Expr *)local_d0,&local_50,local_88,false,true,0,parse_err);
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::
              emplace_back<nivalis::Expr>(local_90,(Expr *)local_d0);
              if (local_d0[0] != (long *)0x0) {
                operator_delete(local_d0[0],local_c0[0] - (long)local_d0[0]);
              }
              bVar6 = true;
            }
            else {
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                        (local_90,&local_78);
              if (uVar4 != 0x80) {
                local_d0[0] = local_c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_d0,local_b0._M_dataplus._M_p,
                           local_b0._M_dataplus._M_p + local_b0._M_string_length);
                std::__cxx11::string::append((char *)local_d0);
                std::__cxx11::string::_M_append((char *)parse_err,(ulong)local_d0[0]);
                if (local_d0[0] != local_c0) {
                  operator_delete(local_d0[0],local_c0[0] + 1);
                }
              }
            }
            if (local_78.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,
                              CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                       local_b0.field_2._M_local_buf[0]) + 1);
            }
            lVar8 = 1;
            bVar3 = true;
          }
        }
        else if (bVar1 == 0x29) {
          if (lVar8 == 0) {
            if (!bVar3) {
              bVar6 = false;
              goto LAB_00129d7f;
            }
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            local_b0._M_string_length = 0;
            local_b0.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::substr((ulong)&local_50,(ulong)expr_str);
            parse(&local_78,&local_50,local_88,true,true,0,&local_b0);
            util::rtrim(&local_b0);
            if ((uVar4 == 0x80) && (local_b0._M_string_length != 0)) {
              parse((Expr *)local_d0,&local_50,local_88,false,true,0,parse_err);
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::
              emplace_back<nivalis::Expr>(local_90,(Expr *)local_d0);
              if (local_d0[0] != (long *)0x0) {
                operator_delete(local_d0[0],local_c0[0] - (long)local_d0[0]);
              }
              bVar6 = true;
            }
            else {
              std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::push_back
                        (local_90,&local_78);
              if (uVar4 != 0x80) {
                local_d0[0] = local_c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_d0,local_b0._M_dataplus._M_p,
                           local_b0._M_dataplus._M_p + local_b0._M_string_length);
                std::__cxx11::string::append((char *)local_d0);
                std::__cxx11::string::_M_append((char *)parse_err,(ulong)local_d0[0]);
                if (local_d0[0] != local_c0) {
                  operator_delete(local_d0[0],local_c0[0] + 1);
                }
              }
            }
            if (local_78.ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,
                              CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                       local_b0.field_2._M_local_buf[0]) + 1);
            }
            bVar3 = false;
            lVar8 = 0;
          }
        }
        else if ((bVar1 != 0x28) && (bVar1 != 0x2c && lVar8 == 0)) {
          return false;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < expr_str->_M_string_length);
  }
  addr_00 = local_58;
  addr = local_5c;
  if (parse_err->_M_string_length == 0) {
    this_00 = (local_80->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar2 = (local_80->exprs).super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pEVar2) {
      this = &local_80->exprs;
      do {
        bVar3 = Expr::has_var(this_00,local_54);
        if ((bVar3) || (bVar3 = Expr::has_var(this_00,addr), bVar3)) {
          __pos = (this->super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>)._M_impl.
                  super__Vector_impl_data._M_start;
LAB_00129d73:
          std::vector<nivalis::Expr,_std::allocator<nivalis::Expr>_>::_M_erase_at_end(this,__pos);
LAB_00129d7f:
          std::__cxx11::string::append((char *)parse_err);
          return bVar6;
        }
        if ((local_80->type == 0x80) && (bVar3 = Expr::has_var(this_00,addr_00), bVar3)) {
          __pos = (local_80->exprs).
                  super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                  super__Vector_impl_data._M_start;
          if ((long)(local_80->exprs).
                    super__Vector_base<nivalis::Expr,_std::allocator<nivalis::Expr>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__pos != 0x30) goto LAB_00129d73;
          local_80->type = 0x28;
        }
        this_00 = this_00 + 1;
      } while (this_00 != pEVar2);
    }
  }
  return bVar6;
}

Assistant:

bool parse_polyline_expr(const std::string& expr_str, Function& func,
                         Environment& env, int x_var, int y_var, int t_var,
                         std::string& parse_err) {
    // Try to parse function as polyline expr
    size_t last_begin = 0, stkh = 0;
    bool has_comma = false;
    bool want_reparse = false;
    const bool is_polyline_type = ((func.type& ~Function::FUNC_TYPE_MOD_ALL)
                            == Function::FUNC_TYPE_GEOM_POLYLINE);
    for (size_t i = 0; i < expr_str.size(); ++i) {
        const char c = expr_str[i];
        if (std::isspace(c)) continue;
        // Handle nested brackets
        if (util::is_open_bracket(c)) ++stkh;
        else if (util::is_close_bracket(c)) --stkh;
        switch(c) {
            case '(':
                if (stkh == 1) {
                    last_begin = i + 1;
                }
                break;
            case ',':
                if (stkh == 1) {
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }
                    last_begin = i + 1;
                    has_comma = true;
                }
                break;
            case ')':
                if (stkh == 0) {
                    if (!has_comma) {
                        // Must have comma
                        parse_err.append("Polyline/parametric expression missing ,");
                        return false;
                    }
                    std::string tmp_err,
                                s = expr_str.substr(last_begin,
                                        i - last_begin);
                    Expr e1 = parse(s, env,
                                true, true, 0, &tmp_err);
                    util::rtrim(tmp_err);
                    if (is_polyline_type && tmp_err.size()) {
                        func.exprs.push_back(parse(s, env,
                                    false, true, 0, &parse_err));
                        want_reparse = true;
                    } else {
                        func.exprs.push_back(e1);
                        if (!is_polyline_type) parse_err.append(tmp_err + "\n");
                    }

                    has_comma = false;
                }
                break;
            default:
                // Can't have things between ), (
                // shouldn't happen since should not detect as polyline
                if (!std::isspace(c) && c != ',' && stkh == 0) return false;
        }
    }
    if (parse_err.empty()) {
        for (Expr& e1 : func.exprs) {
            if (e1.has_var(x_var) || e1.has_var(y_var)) {
                // Can't have x,y, show warning
                func.exprs.clear();
                parse_err.append("x, y disallowed in tuple "
                    "(polyline/parametric equation)\n");
                break;
            } else if (func.type == Function::FUNC_TYPE_GEOM_POLYLINE &&
                       e1.has_var(t_var)) {
                // Detect parametric equation
                if (func.exprs.size() != 2) {
                    func.exprs.clear();
                    parse_err.append("Parametric equation can't have "
                        "more than one tuple\n");
                    break;
                } else {
                    // Parametric detection: only single
                    // point and has t
                    func.type = Function::FUNC_TYPE_PARAMETRIC;
                }
            }
        }
    }
    return want_reparse;
}